

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool IsIdentChar(char c)

{
  undefined1 local_a;
  char c_local;
  
  if (((((c < 'a') || (local_a = true, 'z' < c)) && ((c < '+' || (local_a = true, '9' < c)))) &&
      ((((c < 'A' || (local_a = true, 'Z' < c)) && (local_a = true, c != '_')) &&
       ((local_a = true, c != '$' && (local_a = true, c != '\\')))))) && (local_a = true, c != ' '))
  {
    local_a = c == ':';
  }
  return local_a;
}

Assistant:

static bool IsIdentChar(char c)
{
  return
    ('a' <= c && c <= 'z') ||
    ('+' <= c && c <= '9') ||  // +,-./ and numbers
    ('A' <= c && c <= 'Z') ||
    (c == '_') || (c == '$') || (c == '\\') ||
    (c == ' ') || (c == ':');
}